

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.h
# Opt level: O2

void __thiscall
Liby::BinaryHeap<Liby::WeakTimerHolder>::percolate_down
          (BinaryHeap<Liby::WeakTimerHolder> *this,size_type_conflict hole)

{
  pointer pWVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  WeakTimerHolder tmp;
  WeakTimerHolder local_70;
  
  WeakTimerHolder::WeakTimerHolder
            (&local_70,
             (this->heap).
             super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
             _M_impl.super__Vector_impl_data._M_start + hole);
  uVar4 = (ulong)hole;
  while( true ) {
    uVar2 = (int)uVar4 * 2;
    uVar5 = (ulong)uVar2;
    if (this->size_ < uVar2) break;
    if (uVar2 != this->size_) {
      uVar5 = (ulong)(uVar2 | 1);
      pWVar1 = (this->heap).
               super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar3 = operator<(pWVar1 + uVar5,pWVar1 + uVar2);
      if (!bVar3) {
        uVar5 = (ulong)uVar2;
      }
    }
    bVar3 = operator<((this->heap).
                      super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar5,&local_70);
    if (!bVar3) break;
    pWVar1 = (this->heap).
             super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
             _M_impl.super__Vector_impl_data._M_start;
    WeakTimerHolder::operator=(pWVar1 + uVar4,pWVar1 + uVar5);
    uVar4 = uVar5;
  }
  WeakTimerHolder::operator=
            ((this->heap).
             super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar4,&local_70);
  WeakTimerHolder::~WeakTimerHolder(&local_70);
  return;
}

Assistant:

void percolate_down(size_type hole) {
        size_type child;
        T tmp = heap[hole];

        for (; hole * 2 <= size_; hole = child) {
            child = hole * 2;
            if (child != size_ && heap[child + 1] < heap[child])
                child++;
            if (heap[child] < tmp) {
                heap[hole] = heap[child];
            } else {
                break;
            }
        }
        heap[hole] = tmp;
    }